

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_flatten_after_innerproduct(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int top_blob_index_final;
  Flatten *flatten;
  InnerProduct *innerproduct;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  char *in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  int local_18;
  int local_10;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  iVar5 = (int)sVar6;
  local_10 = 0;
  do {
    if (iVar5 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar4) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
      iVar1 = *pvVar8;
      local_18 = local_10;
      do {
        do {
          do {
            local_18 = local_18 + 1;
            if (iVar5 <= local_18) goto LAB_0011958d;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_18);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          } while (bVar4);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_18);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
        } while (sVar6 != 1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
      } while (*pvVar8 != iVar1);
LAB_0011958d:
      if (local_18 != iVar5) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        pLVar2 = *ppLVar7;
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        pLVar3 = *ppLVar7;
        in_stack_ffffffffffffffb0 = _stderr;
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffffb0,"eliminate_flatten_after_innerproduct %s %s\n",uVar9,
                uVar10);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        iVar1 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
        *pvVar8 = iVar1;
        pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar1);
        pvVar11->producer = local_10;
        std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_flatten_after_innerproduct()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Flatten
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_innerproduct %s %s\n", innerproduct->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}